

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcEdgeLogLikelihoods
          (BeagleCPU4StateImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  undefined8 *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  double *pdVar19;
  double *pdVar20;
  int *piVar21;
  double *pdVar22;
  double *pdVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  long lVar33;
  double *pdVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  
  pdVar19 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials[parIndex];
  pdVar34 = (this->super_BeagleCPUImpl<double,_1,_0>).gTransitionMatrices[probIndex];
  pdVar20 = (this->super_BeagleCPUImpl<double,_1,_0>).gCategoryWeights[categoryWeightsIndex];
  memset((this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp,0,
         (long)(this->super_BeagleCPUImpl<double,_1,_0>).kStateCount *
         (long)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount * 8);
  if ((childIndex < (this->super_BeagleCPUImpl<double,_1,_0>).kTipCount) &&
     (piVar21 = (this->super_BeagleCPUImpl<double,_1,_0>).gTipStates[childIndex],
     piVar21 != (int *)0x0)) {
    lVar25 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
    uVar24 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    if (0 < lVar25) {
      iVar17 = (this->super_BeagleCPUImpl<double,_1,_0>).kExtraPatterns;
      pdVar22 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
      lVar29 = 0;
      iVar30 = 0;
      iVar31 = 0;
      do {
        if (0 < (int)uVar24) {
          auVar44._8_8_ = 0;
          auVar44._0_8_ = pdVar20[lVar29];
          lVar33 = 0;
          do {
            iVar18 = *(int *)((long)piVar21 + lVar33);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = pdVar22[lVar33];
            auVar47._8_8_ = 0;
            auVar47._0_8_ = pdVar34[iVar18 + iVar31] * pdVar19[iVar30 + lVar33];
            auVar45 = vfmadd213sd_fma(auVar47,auVar44,auVar8);
            pdVar22[lVar33] = auVar45._0_8_;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = pdVar22[lVar33 + 1];
            auVar48._8_8_ = 0;
            auVar48._0_8_ = pdVar34[iVar31 + 5 + iVar18] * pdVar19[(long)iVar30 + lVar33 + 1];
            auVar45 = vfmadd213sd_fma(auVar48,auVar44,auVar9);
            pdVar22[lVar33 + 1] = auVar45._0_8_;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = pdVar22[lVar33 + 2];
            auVar49._8_8_ = 0;
            auVar49._0_8_ = pdVar34[iVar31 + 10 + iVar18] * pdVar19[(long)iVar30 + lVar33 + 2];
            auVar45 = vfmadd213sd_fma(auVar49,auVar44,auVar10);
            pdVar22[lVar33 + 2] = auVar45._0_8_;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = pdVar22[lVar33 + 3];
            auVar50._8_8_ = 0;
            auVar50._0_8_ = pdVar34[iVar18 + iVar31 + 0xf] * pdVar19[(long)iVar30 + lVar33 + 3];
            auVar45 = vfmadd213sd_fma(auVar50,auVar44,auVar11);
            pdVar22[lVar33 + 3] = auVar45._0_8_;
            lVar33 = lVar33 + 4;
          } while ((ulong)uVar24 * 4 - lVar33 != 0);
          iVar30 = iVar30 + (int)lVar33;
        }
        iVar30 = iVar30 + iVar17 * 4;
        iVar31 = iVar31 + 0x14;
        lVar29 = lVar29 + 1;
      } while (lVar29 != lVar25);
    }
  }
  else {
    lVar25 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
    uVar24 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    if (0 < lVar25) {
      pdVar22 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
      lVar29 = 0;
      lVar33 = 0;
      iVar30 = 0;
      pdVar23 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials[childIndex];
      iVar17 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
      do {
        if (0 < (int)uVar24) {
          auVar51._8_8_ = 0;
          auVar51._0_8_ = pdVar34[lVar33];
          auVar56._8_8_ = 0;
          auVar56._0_8_ = pdVar34[lVar33 + 1];
          auVar57._8_8_ = 0;
          auVar57._0_8_ = pdVar34[lVar33 + 2];
          auVar58._8_8_ = 0;
          auVar58._0_8_ = pdVar34[lVar33 + 3];
          auVar59._8_8_ = 0;
          auVar59._0_8_ = pdVar34[lVar33 + 5];
          auVar60._8_8_ = 0;
          auVar60._0_8_ = pdVar34[lVar33 + 6];
          auVar61._8_8_ = 0;
          auVar61._0_8_ = pdVar34[lVar33 + 7];
          auVar62._8_8_ = 0;
          auVar62._0_8_ = pdVar34[lVar33 + 8];
          auVar63._8_8_ = 0;
          auVar63._0_8_ = pdVar34[lVar33 + 10];
          auVar64._8_8_ = 0;
          auVar64._0_8_ = pdVar34[lVar33 + 0xb];
          auVar65._8_8_ = 0;
          auVar65._0_8_ = pdVar34[lVar33 + 0xc];
          auVar66._8_8_ = 0;
          auVar66._0_8_ = pdVar34[lVar33 + 0xd];
          auVar67._8_8_ = 0;
          auVar67._0_8_ = pdVar34[lVar33 + 0xf];
          auVar68._8_8_ = 0;
          auVar68._0_8_ = pdVar34[lVar33 + 0x10];
          auVar69._8_8_ = 0;
          auVar69._0_8_ = pdVar34[lVar33 + 0x11];
          dVar43 = pdVar34[lVar33 + 0x12];
          lVar26 = (long)iVar30;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = pdVar20[lVar29];
          lVar27 = 0x18;
          uVar32 = uVar24;
          do {
            uVar28 = *(ulong *)((long)pdVar23 + lVar27 + lVar26 * 8 + -0x10);
            uVar2 = *(ulong *)((long)pdVar23 + lVar27 + lVar26 * 8 + -0x18);
            uVar3 = *(ulong *)((long)pdVar23 + lVar27 + lVar26 * 8 + -8);
            uVar4 = *(ulong *)((long)pdVar23 + lVar27 + lVar26 * 8);
            auVar73._8_8_ = 0;
            auVar73._0_8_ = uVar28;
            auVar35 = vmulsd_avx512f(auVar56,auVar73);
            auVar36 = vmulsd_avx512f(auVar60,auVar73);
            auVar74._8_8_ = 0;
            auVar74._0_8_ = uVar28;
            auVar37 = vmulsd_avx512f(auVar64,auVar74);
            auVar38 = vmulsd_avx512f(auVar68,auVar74);
            auVar71._8_8_ = 0;
            auVar71._0_8_ = uVar2;
            auVar35 = vfmadd231sd_avx512f(auVar35,auVar51,auVar71);
            auVar36 = vfmadd231sd_avx512f(auVar36,auVar59,auVar71);
            auVar72._8_8_ = 0;
            auVar72._0_8_ = uVar2;
            auVar37 = vfmadd231sd_avx512f(auVar37,auVar63,auVar72);
            auVar38 = vfmadd231sd_avx512f(auVar38,auVar67,auVar72);
            auVar75._8_8_ = 0;
            auVar75._0_8_ = uVar3;
            auVar35 = vfmadd231sd_avx512f(auVar35,auVar57,auVar75);
            auVar36 = vfmadd231sd_avx512f(auVar36,auVar61,auVar75);
            auVar76._8_8_ = 0;
            auVar76._0_8_ = uVar3;
            auVar37 = vfmadd231sd_avx512f(auVar37,auVar65,auVar76);
            auVar38 = vfmadd231sd_avx512f(auVar38,auVar69,auVar76);
            auVar77._8_8_ = 0;
            auVar77._0_8_ = uVar4;
            auVar39 = vfmadd231sd_avx512f(auVar35,auVar58,auVar77);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = *(ulong *)((long)pdVar19 + lVar27 + lVar26 * 8 + -0x18);
            auVar35 = vmulsd_avx512f(auVar39,auVar35);
            auVar39 = vfmadd231sd_avx512f(auVar36,auVar62,auVar77);
            auVar78._8_8_ = 0;
            auVar78._0_8_ = uVar4;
            auVar40 = vfmadd231sd_avx512f(auVar37,auVar66,auVar78);
            auVar70._8_8_ = 0;
            auVar70._0_8_ = dVar43;
            auVar41 = vfmadd231sd_avx512f(auVar38,auVar70,auVar78);
            auVar36._8_8_ = 0;
            auVar36._0_8_ = *(ulong *)((long)pdVar22 + lVar27 + -0x18);
            auVar35 = vfmadd213sd_avx512f(auVar35,auVar45,auVar36);
            puVar1 = (undefined8 *)((long)pdVar22 + lVar27 + -0x18);
            vmovsd_avx512f(auVar35);
            *puVar1 = *puVar1;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = *(ulong *)((long)pdVar19 + lVar27 + lVar26 * 8 + -0x10);
            auVar35 = vmulsd_avx512f(auVar39,auVar37);
            auVar38._8_8_ = 0;
            auVar38._0_8_ = *(ulong *)((long)pdVar22 + lVar27 + -0x10);
            auVar35 = vfmadd213sd_avx512f(auVar35,auVar45,auVar38);
            puVar1 = (undefined8 *)((long)pdVar22 + lVar27 + -0x10);
            vmovsd_avx512f(auVar35);
            *puVar1 = *puVar1;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = *(ulong *)((long)pdVar19 + lVar27 + lVar26 * 8 + -8);
            auVar35 = vmulsd_avx512f(auVar40,auVar39);
            auVar40._8_8_ = 0;
            auVar40._0_8_ = *(ulong *)((long)pdVar22 + lVar27 + -8);
            auVar35 = vfmadd213sd_avx512f(auVar35,auVar45,auVar40);
            puVar1 = (undefined8 *)((long)pdVar22 + lVar27 + -8);
            vmovsd_avx512f(auVar35);
            *puVar1 = *puVar1;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = *(ulong *)((long)pdVar19 + lVar27 + lVar26 * 8);
            auVar35 = vmulsd_avx512f(auVar41,auVar12);
            auVar41._8_8_ = 0;
            auVar41._0_8_ = *(ulong *)((long)pdVar22 + lVar27);
            auVar35 = vfmadd213sd_avx512f(auVar35,auVar45,auVar41);
            vmovsd_avx512f(auVar35);
            *(undefined8 *)((long)pdVar22 + lVar27) = *(undefined8 *)((long)pdVar22 + lVar27);
            lVar27 = lVar27 + 0x20;
            uVar32 = uVar32 - 1;
          } while (uVar32 != 0);
        }
        lVar33 = lVar33 + 0x14;
        lVar29 = lVar29 + 1;
        iVar30 = iVar30 + iVar17 * 4;
      } while (lVar29 != lVar25);
    }
  }
  if (0 < (int)uVar24) {
    lVar25 = 0;
    pdVar19 = (this->super_BeagleCPUImpl<double,_1,_0>).gStateFrequencies[stateFrequenciesIndex];
    pdVar34 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp + 3;
    dVar43 = pdVar19[1];
    dVar5 = *pdVar19;
    dVar6 = pdVar19[2];
    dVar7 = pdVar19[3];
    do {
      auVar52._8_8_ = 0;
      auVar52._0_8_ = dVar5;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = pdVar34[-3];
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar43 * pdVar34[-2];
      auVar45 = vfmadd231sd_fma(auVar46,auVar52,auVar13);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = dVar6;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = pdVar34[-1];
      auVar45 = vfmadd231sd_fma(auVar45,auVar53,auVar14);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = dVar7;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *pdVar34;
      auVar45 = vfmadd231sd_fma(auVar45,auVar54,auVar15);
      dVar42 = log(auVar45._0_8_);
      pdVar34 = pdVar34 + 4;
      (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp[lVar25] = dVar42;
      lVar25 = lVar25 + 1;
      uVar24 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    } while (lVar25 < (int)uVar24);
  }
  if (scalingFactorsIndex != -1) {
    if ((int)uVar24 < 1) {
      *outSumLogLikelihood = 0.0;
      return 0;
    }
    uVar28 = 0;
    pdVar19 = (this->super_BeagleCPUImpl<double,_1,_0>).gScaleBuffers[scalingFactorsIndex];
    pdVar34 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
    do {
      pdVar34[uVar28] = pdVar19[uVar28] + pdVar34[uVar28];
      uVar28 = uVar28 + 1;
    } while (uVar24 != uVar28);
  }
  *outSumLogLikelihood = 0.0;
  if ((int)uVar24 < 1) {
    return 0;
  }
  pdVar19 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternWeights;
  pdVar34 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
  auVar45 = ZEXT816(0) << 0x40;
  uVar28 = 0;
  do {
    auVar55._8_8_ = 0;
    auVar55._0_8_ = pdVar34[uVar28];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = pdVar19[uVar28];
    auVar45 = vfmadd231sd_fma(auVar45,auVar55,auVar16);
    uVar28 = uVar28 + 1;
    dVar43 = auVar45._0_8_;
    *outSumLogLikelihood = dVar43;
  } while (uVar24 != uVar28);
  return (uint)(!NAN(dVar43) && !NAN(dVar43)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoods(const int parIndex,
                                                           const int childIndex,
                                                           const int probIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                           const int scalingFactorsIndex,
                                                           double* outSumLogLikelihood) {
    // TODO: implement derivatives for calculateEdgeLnL

    assert(parIndex >= kTipCount);

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];

                integrationTmp[u    ] += transMatrix[w            + stateChild] * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += transMatrix[w + OFFSET*1 + stateChild] * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += transMatrix[w + OFFSET*2 + stateChild] * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += transMatrix[w + OFFSET*3 + stateChild] * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
		#if 0//
        int v = 0;
		#endif
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
			#if 1//
			int v = l*kPaddedPatternCount*4;
			#endif
            const REALTYPE weight = wt[l];

            PREFETCH_MATRIX(1,transMatrix,w);

            for(int k = 0; k < kPatternCount; k++) {

                const REALTYPE* partials1 = partialsChild;

                PREFETCH_PARTIALS(1,partials1,v);

                DO_INTEGRATION(1);

                integrationTmp[u    ] += sum10 * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += sum11 * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += sum12 * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += sum13 * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
			#if 0//
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
			#endif//
        }
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}